

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void WindowSettingsHandler_ClearAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  ImGuiWindow **ppIVar1;
  long in_RDI;
  int i;
  ImGuiContext *g;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  
  for (iVar2 = 0; iVar2 != *(int *)(in_RDI + 0x1a28); iVar2 = iVar2 + 1) {
    ppIVar1 = ImVector<ImGuiWindow_*>::operator[]
                        ((ImVector<ImGuiWindow_*> *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                         in_stack_ffffffffffffffdc);
    (*ppIVar1)->SettingsOffset = -1;
  }
  ImChunkStream<ImGuiWindowSettings>::clear((ImChunkStream<ImGuiWindowSettings> *)0x181581);
  return;
}

Assistant:

static void WindowSettingsHandler_ClearAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Windows.Size; i++)
        g.Windows[i]->SettingsOffset = -1;
    g.SettingsWindows.clear();
}